

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

int Abc_NtkLevel(Abc_Ntk_t *pNtk)

{
  long *plVar1;
  long lVar2;
  uint uVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  
  if ((pNtk->pManTime == (Abc_ManTime_t *)0x0) || (pNtk->AndGateDelay <= 0.0)) {
    for (iVar7 = 0; iVar7 < pNtk->vCis->nSize; iVar7 = iVar7 + 1) {
      pAVar4 = Abc_NtkCi(pNtk,iVar7);
      *(uint *)&pAVar4->field_0x14 = *(uint *)&pAVar4->field_0x14 & 0xfff;
    }
  }
  else {
    for (iVar7 = 0; iVar7 < pNtk->vCis->nSize; iVar7 = iVar7 + 1) {
      pAVar4 = Abc_NtkCi(pNtk,iVar7);
      fVar10 = Abc_NodeReadArrivalWorst(pAVar4);
      fVar11 = 0.0;
      if (0.0 <= fVar10) {
        fVar11 = fVar10;
      }
      *(uint *)&pAVar4->field_0x14 =
           *(uint *)&pAVar4->field_0x14 & 0xfff | (int)(fVar11 / pNtk->AndGateDelay) << 0xc;
    }
  }
  Abc_NtkIncrementTravId(pNtk);
  if (pNtk->nBarBufs == 0) {
    uVar8 = 0;
    for (iVar7 = 0; iVar7 < pNtk->vObjs->nSize; iVar7 = iVar7 + 1) {
      pAVar4 = Abc_NtkObj(pNtk,iVar7);
      if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
        Abc_NtkLevel_rec(pAVar4);
        uVar3 = *(uint *)&pAVar4->field_0x14 >> 0xc;
        if (uVar8 <= uVar3) {
          uVar8 = uVar3;
        }
      }
    }
  }
  else {
    uVar8 = 0;
    for (iVar7 = 0; iVar9 = pNtk->vCos->nSize, iVar7 < iVar9; iVar7 = iVar7 + 1) {
      if (pNtk->nBarBufs <= iVar7) {
        iVar9 = 0;
      }
      pAVar5 = Abc_NtkCo(pNtk,(iVar9 - pNtk->nBarBufs) + iVar7);
      pAVar4 = (Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray];
      Abc_NtkLevel_rec(pAVar4);
      uVar3 = *(uint *)&pAVar4->field_0x14;
      uVar6 = uVar3 >> 0xc;
      if (uVar8 <= uVar6) {
        uVar8 = uVar6;
      }
      if (iVar7 < pNtk->nBarBufs) {
        plVar1 = (long *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray];
        lVar2 = *(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[6] * 8);
        *(uint *)(lVar2 + 0x14) = *(uint *)(lVar2 + 0x14) & 0xfff | uVar3 & 0xfffff000;
      }
    }
  }
  return uVar8;
}

Assistant:

int Abc_NtkLevel( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i, LevelsMax;
    // set the CI levels
    if ( pNtk->pManTime == NULL || pNtk->AndGateDelay <= 0 )
        Abc_NtkForEachCi( pNtk, pNode, i )
            pNode->Level = 0;
    else
        Abc_NtkForEachCi( pNtk, pNode, i )
            pNode->Level = (int)(Abc_MaxFloat(0, Abc_NodeReadArrivalWorst(pNode)) / pNtk->AndGateDelay);
    // perform the traversal
    LevelsMax = 0;
    Abc_NtkIncrementTravId( pNtk );
    if ( pNtk->nBarBufs == 0 )
    {
        Abc_NtkForEachNode( pNtk, pNode, i )
        {
            Abc_NtkLevel_rec( pNode );
            if ( LevelsMax < (int)pNode->Level )
                LevelsMax = (int)pNode->Level;
        }
    }
    else
    {
        Abc_NtkForEachLiPo( pNtk, pNode, i )
        {
            Abc_Obj_t * pDriver = Abc_ObjFanin0(pNode);
            Abc_NtkLevel_rec( pDriver );
            if ( LevelsMax < (int)pDriver->Level )
                LevelsMax = (int)pDriver->Level;
            // transfer the delay
            if ( i < pNtk->nBarBufs )
                Abc_ObjFanout0(Abc_ObjFanout0(pNode))->Level = pDriver->Level;
        }
    }
    return LevelsMax;
}